

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

int process_stream_file(char *stream_file_name)

{
  bool bVar1;
  bool bVar2;
  _Alloc_hider __s1;
  size_type sVar3;
  uint uVar4;
  int iVar5;
  _Alloc_hider p;
  char *pcVar6;
  size_type sVar7;
  uint uVar8;
  TrustedContext local_34c;
  allocator local_341;
  string code;
  string fileName;
  string buf;
  string child;
  string sqconfig;
  string stream;
  string parent;
  string local_258 [32];
  ifstream tmp;
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  std::ifstream::ifstream(&tmp,stream_file_name,_S_in);
  if ((abStack_218[*(long *)(_tmp + -0x18)] & 5) == 0) {
    stream._M_dataplus._M_p = (pointer)&stream.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&stream,*(undefined8 *)((long)auStack_150 + *(long *)(_tmp + -0x18)),
               0xffffffffffffffff,0);
    if (stream._M_string_length == 0) {
      std::__cxx11::string::string((string *)&sqconfig,"Stream file is empty \'",(allocator *)&buf);
      std::operator+(&code,&sqconfig,stream_file_name);
      std::operator+(&fileName,&code,"\'");
      CompilationContext::globalError(fileName._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&fileName);
      std::__cxx11::string::~string((string *)&code);
      std::__cxx11::string::~string((string *)&sqconfig);
      uVar8 = 1;
    }
    else {
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      uVar8 = 0;
      fileName.field_2._M_local_buf[0] = '\0';
      code._M_dataplus._M_p = (pointer)&code.field_2;
      code._M_string_length = 0;
      sqconfig._M_dataplus._M_p = (pointer)&sqconfig.field_2;
      sqconfig._M_string_length = 0;
      code.field_2._M_local_buf[0] = '\0';
      sqconfig.field_2._M_local_buf[0] = '\0';
      local_34c = TR_CONST;
      bVar2 = false;
      p._M_p = stream._M_dataplus._M_p;
      do {
        buf._M_dataplus._M_p = (pointer)&buf.field_2;
        buf._M_string_length = 0;
        buf.field_2._M_local_buf[0] = '\0';
        p._M_p = next_string(p._M_p,&buf);
        if (bVar2) {
          if ((*buf._M_dataplus._M_p == '#') && (buf._M_dataplus._M_p[1] == '#')) {
LAB_00115b7b:
            if (buf._M_dataplus._M_p[1] != '#') goto LAB_00115b83;
LAB_00115b89:
            uVar4 = process_single_source(&fileName,&code,&sqconfig,false,false);
            uVar8 = uVar8 | uVar4;
            bVar2 = false;
            goto LAB_00115ba9;
          }
          std::__cxx11::string::append((string *)&code);
          std::__cxx11::string::append((char *)&code);
          if (*buf._M_dataplus._M_p == '#') goto LAB_00115b7b;
LAB_00115b83:
          if (*p._M_p == '\0') goto LAB_00115b89;
LAB_00115bb8:
          __s1._M_p = buf._M_dataplus._M_p;
          iVar5 = strncmp(buf._M_dataplus._M_p,"###[FILE_NAME]",0xe);
          if (iVar5 == 0) {
            std::__cxx11::string::string((string *)&parent,__s1._M_p + 0xe,(allocator *)&child);
            std::__cxx11::string::operator=((string *)&fileName,(string *)&parent);
            std::__cxx11::string::~string((string *)&parent);
            trusted::clear();
            code._M_string_length = 0;
            *code._M_dataplus._M_p = '\0';
            bVar1 = true;
            bVar2 = false;
          }
          else {
            iVar5 = strncmp(__s1._M_p,"###[SQCONFIG]",0xd);
            if (iVar5 == 0) {
              std::__cxx11::string::string((string *)&parent,__s1._M_p + 0xd,(allocator *)&child);
              std::__cxx11::string::operator=((string *)&sqconfig,(string *)&parent);
              std::__cxx11::string::~string((string *)&parent);
              bVar1 = true;
            }
            else {
              iVar5 = strcmp(__s1._M_p,"###[LOCALS]");
              bVar1 = true;
              if (iVar5 == 0) {
                local_34c = TR_LOCAL;
              }
              else {
                iVar5 = strcmp(__s1._M_p,"###[GLOBALS]");
                if (iVar5 == 0) {
                  local_34c = TR_GLOBAL;
                }
                else {
                  iVar5 = strcmp(__s1._M_p,"###[CONSTANTS]");
                  if (iVar5 == 0) {
                    local_34c = TR_CONST;
                  }
                  else {
                    iVar5 = strcmp(__s1._M_p,"###[CODE]");
                    sVar3 = buf._M_string_length;
                    if (iVar5 == 0) {
                      bVar1 = true;
                      bVar2 = true;
                    }
                    else {
                      bVar1 = true;
                      if ((buf._M_string_length != 0) && (!bVar2)) {
                        pcVar6 = strchr(__s1._M_p,0x2e);
                        sVar7 = (long)pcVar6 - (long)__s1._M_p;
                        if (pcVar6 == (char *)0x0) {
                          sVar7 = sVar3;
                        }
                        parent._M_dataplus._M_p = (pointer)&parent.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&parent,__s1._M_p,__s1._M_p + sVar7);
                        child._M_string_length = 0;
                        child._M_dataplus._M_p = (pointer)&child.field_2;
                        child.field_2._M_local_buf[0] = '\0';
                        if (pcVar6 != (char *)0x0) {
                          std::__cxx11::string::string(local_258,pcVar6 + 1,&local_341);
                          std::__cxx11::string::operator=((string *)&child,local_258);
                          std::__cxx11::string::~string(local_258);
                        }
                        trusted::add(local_34c,&parent,&child);
                        std::__cxx11::string::~string((string *)&child);
                        std::__cxx11::string::~string((string *)&parent);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
LAB_00115ba9:
          if (*p._M_p != '\0') goto LAB_00115bb8;
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)&buf);
      } while (bVar1);
      std::__cxx11::string::~string((string *)&sqconfig);
      std::__cxx11::string::~string((string *)&code);
      std::__cxx11::string::~string((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&stream);
  }
  else {
    std::__cxx11::string::string((string *)&code,"Cannot open strem file \'",(allocator *)&sqconfig)
    ;
    std::operator+(&fileName,&code,stream_file_name);
    std::operator+(&stream,&fileName,"\'");
    CompilationContext::globalError(stream._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&stream);
    std::__cxx11::string::~string((string *)&fileName);
    std::__cxx11::string::~string((string *)&code);
    uVar8 = 1;
  }
  std::ifstream::~ifstream(&tmp);
  return uVar8;
}

Assistant:

int process_stream_file(const char * stream_file_name)
{
  ifstream tmp(stream_file_name);
  if (tmp.fail())
  {
    CompilationContext::globalError((string("Cannot open strem file '") + stream_file_name + "'").c_str());
    return 1;
  }

  string stream((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  if (stream.empty())
  {
    CompilationContext::globalError((string("Stream file is empty '") + stream_file_name + "'").c_str());
    return 1;
  }

  int res = 0;
  const char * p = stream.c_str();

  string fileName;
  trusted::TrustedContext trustedContext = trusted::TR_CONST;
  string code;
  string sqconfig;
  bool insideCode = false;

  for (;;)
  {
    string buf;
    p = next_string(p, buf);

    if (insideCode)
    {
      if (buf[0] != '#' || buf[1] != '#')
      {
        code += buf;
        code += "\n";
      }

      if ((buf[0] == '#' && buf[1] == '#') || !*p) // end of code
      {
        res |= process_single_source(fileName, code, sqconfig, false, false);
        insideCode = false;
      }
    }

    if (!*p)
      break;

    if (!strncmp(buf.c_str(), "###[FILE_NAME]", sizeof("###[FILE_NAME]") - 1))
    {
      fileName = string(buf.c_str() + sizeof("###[FILE_NAME]") - 1);
      trusted::clear();
      code.clear();
      insideCode = false;
    }
    else if (!strncmp(buf.c_str(), "###[SQCONFIG]", sizeof("###[SQCONFIG]") - 1))
      sqconfig = string(buf.c_str() + sizeof("###[SQCONFIG]") - 1);
    else if (!strcmp(buf.c_str(), "###[LOCALS]"))
      trustedContext = trusted::TR_LOCAL;
    else if (!strcmp(buf.c_str(), "###[GLOBALS]"))
      trustedContext = trusted::TR_GLOBAL;
    else if (!strcmp(buf.c_str(), "###[CONSTANTS]"))
      trustedContext = trusted::TR_CONST;
    else if (!strcmp(buf.c_str(), "###[CODE]"))
    {
      insideCode = true;
    }
    else if (!buf.empty() && !insideCode)
    {
      const char * dot = strchr(buf.c_str(), '.');
      string parent(buf.c_str(), dot ? dot - buf.c_str() : buf.length());
      string child;
      if (dot)
        child = string(dot + 1);

      trusted::add(trustedContext, parent, child);
    }
  }

  return res;
}